

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_pre.hpp
# Opt level: O2

Array __thiscall notch::pre::OneHotEncoder::unapply(OneHotEncoder *this,Array *input)

{
  float fVar1;
  long lVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  ostream *poVar5;
  invalid_argument *this_00;
  size_t i;
  long lVar6;
  long *in_RDX;
  float *extraout_RDX;
  float *extraout_RDX_00;
  float *extraout_RDX_01;
  float *pfVar7;
  Array *this_01;
  undefined4 uVar8;
  size_t outCol;
  _func_int **pp_Var9;
  long lVar10;
  long lVar11;
  long lVar12;
  float fVar13;
  Array AVar14;
  string local_1c8 [32];
  ostringstream ss;
  
  if (*in_RDX == input[5]._M_size + (long)input[5]._M_data) {
    _ss = 0;
    core::std::valarray<float>::valarray
              ((valarray<float> *)this,(float *)&ss,*in_RDX - (long)input[5]._M_data);
    this_01 = input + 2;
    lVar11 = 0;
    pfVar7 = extraout_RDX;
    for (pp_Var9 = (_func_int **)0x0;
        pp_Var9 < (this->super_ADatasetTransformer)._vptr_ADatasetTransformer;
        pp_Var9 = (_func_int **)((long)pp_Var9 + 1)) {
      uVar8 = SUB84(pp_Var9,0);
      _ss = uVar8;
      sVar3 = core::std::
              map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::count((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                       *)this_01,(key_type *)&ss);
      if (sVar3 == 0) {
        (this->inputColumns).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[(long)pp_Var9] = *(int *)(in_RDX[1] + lVar11 * 4);
        lVar12 = 1;
        pfVar7 = extraout_RDX_00;
      }
      else {
        _ss = uVar8;
        pmVar4 = core::std::
                 map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                 ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                               *)this_01,(key_type *)&ss);
        lVar12 = (long)(pmVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(pmVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start >> 2;
        fVar13 = -3.4028235e+38;
        lVar10 = 0;
        for (lVar6 = 0; lVar12 != lVar6; lVar6 = lVar6 + 1) {
          fVar1 = *(float *)(lVar11 * 4 + in_RDX[1] + lVar6 * 4);
          lVar2 = lVar6;
          if (fVar1 <= fVar13) {
            fVar1 = fVar13;
            lVar2 = lVar10;
          }
          lVar10 = lVar2;
          fVar13 = fVar1;
        }
        _ss = uVar8;
        pmVar4 = core::std::
                 map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                 ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                               *)this_01,(key_type *)&ss);
        (this->inputColumns).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[(long)pp_Var9] =
             (int)(float)(pmVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start[lVar10];
        pfVar7 = extraout_RDX_01;
      }
      lVar11 = lVar11 + lVar12;
    }
    AVar14._M_data = pfVar7;
    AVar14._M_size = (size_t)this;
    return AVar14;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  poVar5 = std::operator<<((ostream *)&ss,"input.size(): ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  poVar5 = std::operator<<(poVar5,", expected: ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(this_00,local_1c8);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

virtual Array unapply(const Array &input) {
        if (input.size() != nInputCols + nExtraCols) {
            std::ostringstream ss;
            ss << "input.size(): " << input.size()
               << ", expected: " << nInputCols + nExtraCols;
            throw std::invalid_argument(ss.str());
        }
        Array output(0.0, input.size() - nExtraCols);
        size_t inCol = 0;
        for (size_t outCol = 0; outCol < output.size(); ++outCol) {
            if (columnValues.count(outCol)) { // replace with one column
                // find the column with the largest output
                size_t nColsPerFeature = columnValues[outCol].size();
                float maxVal = std::numeric_limits<float>::lowest();
                size_t maxIdx = 0;
                for (size_t i = 0; i < nColsPerFeature; ++i) {
                    if (input[inCol + i] > maxVal) {
                        maxVal = input[inCol + i];
                        maxIdx = i;
                    }
                }
                // use the category corresponding to the largest value
                output[outCol] = columnValues[outCol][maxIdx];
                inCol += nColsPerFeature;
            } else {
                output[outCol] = input[inCol];
                ++inCol;
            }
        }
        return output;
    }